

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::DecommitNow(HeapInfo *this,bool all)

{
  bool all_local;
  HeapInfo *this_local;
  
  ForEachPageAllocator<Memory::HeapInfo::DecommitNow(bool)::__0>(this,(anon_class_1_1_ba1d3501)all);
  return;
}

Assistant:

void
HeapInfo::DecommitNow(bool all)
{
    ForEachPageAllocator([=](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->DecommitNow(all);
    });
}